

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertiontests.cpp
# Opt level: O2

void anon_unknown.dwarf_388b1::assert_not_in1(void)

{
  initializer_list<int> __l;
  allocator local_a9;
  Assert local_a8;
  string msg;
  vector<int,_std::allocator<int>_> v;
  
  msg._M_dataplus._M_p = (pointer)0x100000000;
  msg._M_string_length = 0x300000002;
  __l._M_len = 4;
  __l._M_array = (iterator)&msg;
  std::vector<int,_std::allocator<int>_>::vector(&v,__l,(allocator_type *)&local_a8);
  msg._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_all_cmakelists_25/john-mullins[P]TestFramework/tests/assertiontests.cpp"
  ;
  msg._M_string_length = CONCAT44(msg._M_string_length._4_4_,0x13b);
  UnitTests::Assert::NotIn<int,std::vector<int,std::allocator<int>>&>((Assert *)&msg,3,&v);
  local_a8.m_file =
       "/workspace/llm4binary/github/license_all_cmakelists_25/john-mullins[P]TestFramework/tests/assertiontests.cpp"
  ;
  local_a8.m_line = 0x13c;
  std::__cxx11::string::string((string *)&msg,"ASSERT_NOT_IN should have fired here.",&local_a9);
  UnitTests::Assert::Fail(&local_a8,&msg);
}

Assistant:

TEST(assert_not_in1)
    {
        try
        {
            std::vector<int> v{0, 1, 2, 3};
            ASSERT_NOT_IN(3, v);
            FAIL("ASSERT_NOT_IN should have fired here.");
        }
        catch (UnitTests::TestFailure& e)
        {
            std::string msg = e.what();
            std::string expected =
                "error A1000: Assertion failure : Did not expect container to contain 3, actual contents :\n"
                "\t[0, 1, 2, 3]";
            if (msg.find(expected) == std::string::npos)
            {
                throw UnitTests::TestFailure("Unexpected message from ASSERT_NOT_IN", __FILE__, __LINE__);
            }
        }
    }